

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool __thiscall Datetime::validate(Datetime *this)

{
  uint year;
  uint uVar1;
  int iVar2;
  short sVar3;
  int iVar4;
  
  year = this->_year;
  if (year == 0 || 0xffffe05b < year - 10000) {
    if (0xc < (uint)this->_month) {
      return false;
    }
    if (0x35 < (uint)this->_week) {
      return false;
    }
    if ((this->_weekday <= (int)((weekstart == 1) + 6) &&
         (int)(uint)(weekstart == 1) <= this->_weekday) &&
       ((uVar1 = this->_julian, uVar1 == 0 ||
        ((0 < (int)uVar1 &&
         (sVar3 = (short)year,
         uVar1 <= ((ushort)((ushort)(sVar3 * 0x5c29) >> 4 | sVar3 * -0x7000) < 0xa4 ||
                  0x28f < (ushort)((ushort)(sVar3 * 0x5c29) >> 2 | sVar3 * 0x4000) &&
                  (year & 3) == 0) + 0x16d)))))) {
      iVar2 = this->_day;
      if (iVar2 == 0) {
        if ((uint)this->_seconds < 0x15181) goto LAB_0015fcf2;
      }
      else if (0 < iVar2) {
        iVar4 = daysInMonth(year,this->_month);
        if (iVar4 < iVar2) {
          return false;
        }
        if (0x15180 < (uint)this->_seconds) {
          return false;
        }
LAB_0015fcf2:
        return this->_offset + 0x15180U < 0x2a301;
      }
    }
  }
  return false;
}

Assistant:

bool Datetime::validate ()
{
  // for ISO 8601 week specification: YYYY-Www-D where D is 1-7 (Mon-Sun)
  int wks = (Datetime::weekstart == 1 ? 1: 0);
  int wke = (Datetime::weekstart == 1 ? 7: 6);

  // _year;
  if ((_year    && (_year    <   1900 || _year    >                                  9999)) ||
      (_month   && (_month   <      1 || _month   >                                    12)) ||
      (_week    && (_week    <      1 || _week    >                                    53)) ||
      (true     && (_weekday <    wks || _weekday >                                   wke)) ||
      (_julian  && (_julian  <      1 || _julian  >          Datetime::daysInYear (_year))) ||
      (_day     && (_day     <      1 || _day     > Datetime::daysInMonth (_year, _month))) ||
      (_seconds && (_seconds <      1 || _seconds >                                 86400)) ||
      (_offset  && (_offset  < -86400 || _offset  >                                 86400)))
    return false;

  return true;
}